

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# list.cpp
# Opt level: O3

bool __thiscall rlist::listAppend(rlist *this,void *node)

{
  listNode *plVar1;
  listNode *plVar2;
  listNode *plVar3;
  listNode *plVar4;
  
  plVar1 = this->rl->head;
  if (plVar1 == (listNode *)0x0) {
    this->view = (listNode *)0x0;
    this->rl->head = (listNode *)node;
  }
  else {
    plVar2 = plVar1->next;
    plVar4 = plVar1;
    while (plVar3 = plVar1, plVar2 != (listNode *)0x0) {
      plVar2 = plVar3->next;
      plVar1 = plVar2;
      plVar4 = plVar3;
    }
    this->view = plVar4;
    plVar4->next = (listNode *)node;
    *(listNode **)node = plVar4;
    *(undefined8 *)((long)node + 8) = 0;
  }
  return true;
}

Assistant:

listNode * rlist::listLast(){
    if(rl->head!=NULL){
        if(rl->head->next!=NULL){
            view=rl->head;
            while(view->next!=NULL){
                view=view->next;
            }
            return view;
        }else{
            return rl->head;
        }
    }
    return NULL;
}